

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O2

NJDNode * NJD_remove_node(NJD *njd,NJDNode *node)

{
  _NJDNode *p_Var1;
  NJDNode *pNVar2;
  
  if (njd->head == node) {
    if (njd->tail != node) {
      pNVar2 = node->next;
      njd->head = pNVar2;
      pNVar2->prev = (_NJDNode *)0x0;
      goto LAB_0016f61c;
    }
    njd->head = (NJDNode *)0x0;
    njd->tail = (NJDNode *)0x0;
  }
  else {
    if (njd->tail != node) {
      p_Var1 = node->prev;
      pNVar2 = node->next;
      p_Var1->next = pNVar2;
      pNVar2->prev = p_Var1;
      goto LAB_0016f61c;
    }
    p_Var1 = node->prev;
    njd->tail = p_Var1;
    p_Var1->next = (_NJDNode *)0x0;
  }
  pNVar2 = (NJDNode *)0x0;
LAB_0016f61c:
  NJDNode_clear(node);
  free(node);
  return pNVar2;
}

Assistant:

NJDNode *NJD_remove_node(NJD * njd, NJDNode * node)
{
   NJDNode *next;

   if (node == njd->head && node == njd->tail) {
      njd->head = NULL;
      njd->tail = NULL;
      next = NULL;
   } else if (node == njd->head) {
      njd->head = node->next;
      njd->head->prev = NULL;
      next = njd->head;
   } else if (node == njd->tail) {
      njd->tail = node->prev;
      njd->tail->next = NULL;
      next = NULL;
   } else {
      node->prev->next = node->next;
      node->next->prev = node->prev;
      next = node->next;
   }
   NJDNode_clear(node);
   free(node);
   return next;
}